

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::Parser(Parser *this,Callbacks *cb,ParserOptions opts)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  State local_a8;
  
  (this->m_options).flags = opts.flags;
  (this->m_file).str = (char *)0x0;
  (this->m_file).len = 0;
  (this->m_buf).str = (char *)0x0;
  (this->m_buf).len = 0;
  this->m_root_id = 0xffffffffffffffff;
  this->m_tree = (Tree *)0x0;
  detail::stack<c4::yml::Parser::State,_16UL>::stack(&this->m_stack,cb);
  (this->m_val_tag).str = (char *)0x0;
  (this->m_val_tag).len = 0;
  (this->m_key_tag2).len = 0;
  this->m_val_tag_indentation = 0;
  (this->m_key_tag).len = 0;
  (this->m_key_tag2).str = (char *)0x0;
  this->m_key_tag2_indentation = 0;
  (this->m_key_tag).str = (char *)0x0;
  this->m_state = (State *)0x0;
  this->m_key_tag_indentation = 0;
  this->m_key_anchor_was_before = false;
  this->m_key_anchor_indentation = 0;
  (this->m_key_anchor).str = (char *)0x0;
  (this->m_key_anchor).len = 0;
  this->m_val_anchor_indentation = 0;
  (this->m_val_anchor).str = (char *)0x0;
  (this->m_val_anchor).len = 0;
  (this->m_filter_arena).str = (char *)0x0;
  (this->m_filter_arena).len = 0;
  this->m_newline_offsets = (size_t *)0x0;
  this->m_newline_offsets_size = 0;
  this->m_newline_offsets_capacity = 0;
  (this->m_newline_offsets_buf).str = (char *)0x0;
  (this->m_newline_offsets_buf).len = 0;
  local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
  memset(&local_a8.level,0,0x90);
  detail::stack<c4::yml::Parser::State,_16UL>::push(&this->m_stack,&local_a8);
  sVar3 = (this->m_stack).m_size;
  if (sVar3 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_a8.scalar =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    local_a8.flags = 0;
    local_a8._4_4_ = 0;
    local_a8.level = 0x5c5c;
    local_a8.node_id = 0;
    (*(code *)PTR_error_impl_00246018)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar3 = (this->m_stack).m_size;
  }
  this->m_state = (this->m_stack).m_stack + (sVar3 - 1);
  return;
}

Assistant:

Parser::Parser(Callbacks const& cb, ParserOptions opts)
    : m_options(opts)
    , m_file()
    , m_buf()
    , m_root_id(NONE)
    , m_tree()
    , m_stack(cb)
    , m_state()
    , m_key_tag_indentation(0)
    , m_key_tag2_indentation(0)
    , m_key_tag()
    , m_key_tag2()
    , m_val_tag_indentation(0)
    , m_val_tag()
    , m_key_anchor_was_before(false)
    , m_key_anchor_indentation(0)
    , m_key_anchor()
    , m_val_anchor_indentation(0)
    , m_val_anchor()
    , m_filter_arena()
    , m_newline_offsets()
    , m_newline_offsets_size(0)
    , m_newline_offsets_capacity(0)
    , m_newline_offsets_buf()
{
    m_stack.push(State{});
    m_state = &m_stack.top();
}